

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array2d_kernel.h
# Opt level: O3

bool __thiscall
dlib::array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_>::move_next
          (array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_> *this)

{
  float *pfVar1;
  
  pfVar1 = this->cur;
  if (pfVar1 == (float *)0x0) {
    if (this->at_start_ == true) {
      this->cur = this->data;
      this->at_start_ = false;
      return this->data != (float *)0x0;
    }
  }
  else {
    if (pfVar1 != this->last) {
      this->cur = pfVar1 + 1;
      return true;
    }
    this->cur = (float *)0x0;
  }
  return false;
}

Assistant:

bool move_next (
        ) const
        {
            if (cur != 0)
            {
                if (cur != last)
                {
                    ++cur;
                    return true;
                }
                cur = 0;
                return false;
            }
            else if (at_start_)
            {
                cur = data;
                at_start_ = false;
                return (data != 0);
            }
            else
            {
                return false;
            }
        }